

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,double val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  _Alloc_hider __src;
  string *val_00;
  reference pvVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  double dVar5;
  string_view fmt;
  format_args args;
  complex<double> cvec;
  json json;
  NamedPoint local_90;
  data local_68;
  double local_58;
  double local_50;
  data local_48;
  data local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  dVar5 = val;
  local_58 = val;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    fmt.size_ = 10;
    fmt.data_ = (char *)0x2;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    local_68._0_8_ = val;
    ::fmt::v11::vformat_abi_cxx11_(&local_90.name,(v11 *)0x44c60e,fmt,args);
    local_28._M_len = local_90.name._M_string_length;
    local_28._M_str = local_90.name._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p == &local_90.name.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00226483;
  case HELICS_INT:
switchD_002261f5_caseD_2:
    local_90.name._M_dataplus._M_p = (pointer)(long)dVar5;
    goto LAB_002264e2;
  case HELICS_COMPLEX:
    local_90.name._M_string_length = 0;
    local_90.name._M_dataplus._M_p = (pointer)val;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_90);
    break;
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,&local_58,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    local_90.name._M_string_length = 0;
    local_90.name._M_dataplus._M_p = (pointer)val;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_90,1);
    break;
  case HELICS_NAMED_POINT:
    paVar1 = &local_90.name.field_2;
    local_90.name._M_dataplus._M_p = (pointer)paVar1;
    local_50 = val;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"value","");
    local_90.value = local_50;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
LAB_00226483:
    operator_delete(local_90.name._M_dataplus._M_p,local_90.name.field_2._M_allocated_capacity + 1);
    break;
  case HELICS_BOOL:
    local_90.name._M_string_length = 0x45ed45;
    if (val != 0.0) {
      local_90.name._M_string_length = 0x466467;
    }
    if (NAN(val)) {
      local_90.name._M_string_length = 0x466467;
    }
    local_90.name._M_string_length = local_90.name._M_string_length + 1;
    local_90.name._M_dataplus._M_p = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_90)
    ;
    break;
  case HELICS_TIME:
    local_90.name._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
    if (val <= -9223372036.854765) {
      local_90.name._M_dataplus._M_p = (pointer)0x8000000000000001;
    }
    else if (val < 9223372036.854765) {
      dVar5 = val * 1000000000.0 +
              *(double *)(&DAT_00436020 + (ulong)(0.0 <= val * 1000000000.0) * 8);
      goto switchD_002261f5_caseD_2;
    }
LAB_002264e2:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_90);
    break;
  default:
    if (type == HELICS_JSON) {
      local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
      local_68.m_value.object = (object_t *)0x0;
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_DOUBLE);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_68,"type");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_38.m_type;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar2;
      local_38.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      local_48.m_type = null;
      local_48._1_7_ = 0;
      local_48.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,local_58);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_68,"value");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_48.m_type;
      local_48.m_type = vVar2;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value.object = (object_t *)local_48.m_value;
      local_48.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString(&local_90.name,(json *)&local_68,true);
      __src._M_p = local_90.name._M_dataplus._M_p;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_90.name._M_string_length);
      __return_storage_ptr__->bufferSize = local_90.name._M_string_length;
      memcpy(__return_storage_ptr__->heap,__src._M_p,local_90.name._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
        operator_delete(local_90.name._M_dataplus._M_p,
                        local_90.name.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_68);
      return __return_storage_ptr__;
    }
  case HELICS_DOUBLE:
    ValueConverter<double>::convert(__return_storage_ptr__,&local_58);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, double val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
        default:
            return ValueConverter<double>::convert(val);
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(val).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(val, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsDoubleString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{"value", val});
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cvec(val, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cvec, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&val, 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_DOUBLE);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}